

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result,
          FlatAllocator *alloc)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  FlatAllocator *descriptor;
  Descriptor *proto_00;
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int32_t iVar6;
  int iVar7;
  string *psVar8;
  DescriptorStringView psVar9;
  pointer pTVar10;
  pointer prVar11;
  FieldDescriptorProto *pFVar12;
  PointerT<google::protobuf::EnumValueOptions> pEVar13;
  OneofDescriptorProto *proto_01;
  FieldDescriptor *pFVar14;
  EnumDescriptor *pEVar15;
  EnumDescriptorProto *proto_02;
  PointerT<google::protobuf::ServiceOptions> pSVar16;
  DescriptorProto_ExtensionRange *pDVar17;
  PointerT<google::protobuf::FileOptions> pFVar18;
  DescriptorProto_ReservedRange *pDVar19;
  Descriptor *pDVar20;
  DescriptorProto *proto_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar21;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>_>
  pMVar22;
  string_view sVar23;
  string_view sVar24;
  DescriptorStringView local_350;
  anon_class_16_2_65e56138_conflict local_340;
  VoidPtr local_330;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_328;
  string_view local_320;
  ExtensionRange *local_310;
  ExtensionRange *range2_2;
  undefined1 auStack_300 [4];
  int j_4;
  ReservedRange **local_2f8;
  VoidPtr local_2f0;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_2e8;
  string_view local_2e0;
  ReservedRange *local_2d0;
  ReservedRange *range2_1;
  ExtensionRange *pEStack_2c0;
  int j_3;
  ExtensionRange *range1_1;
  anon_class_8_1_a7e8901a aStack_2b0;
  int i_11;
  VoidPtr local_2a8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_2a0;
  string_view local_298;
  anon_class_8_1_a7e8901a local_288;
  VoidPtr local_280;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_278;
  string_view local_270;
  ReservedRange *local_260;
  ReservedRange *range_1;
  undefined1 auStack_250 [4];
  int j_2;
  FieldDescriptor **local_248;
  VoidPtr local_240;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_238;
  string_view local_230;
  ExtensionRange *local_220;
  ExtensionRange *range;
  FieldDescriptor *pFStack_210;
  int j_1;
  FieldDescriptor *field;
  anon_class_8_1_898f2789 aStack_200;
  int i_10;
  VoidPtr local_1f8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_1f0;
  string_view local_1e8;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  local_1d8;
  reference local_1c0;
  string *name;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  VoidPtr local_170;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_168;
  string_view local_160;
  MaybeInitializedPtr local_150;
  DescriptorProto_ReservedRange *range2;
  DescriptorProto_ReservedRange *pDStack_140;
  int j;
  DescriptorProto_ReservedRange *range1;
  Symbol SStack_130;
  int i_9;
  string_view local_128;
  string_view local_118;
  int local_104;
  int local_100;
  int i_8;
  int reserved_name_count;
  int i_7;
  string_view local_e8;
  IncrementWhenDestroyed local_d8;
  IncrementWhenDestroyed revert;
  int local_bc;
  int local_b8;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  undefined1 local_90 [8];
  iterator it;
  string_view scope;
  FlatAllocator *alloc_local;
  Descriptor *result_local;
  Descriptor *parent_local;
  DescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  alloc_local = (FlatAllocator *)result;
  result_local = parent;
  parent_local = (Descriptor *)proto;
  proto_local = (DescriptorProto *)this;
  if (parent == (Descriptor *)0x0) {
    local_350 = FileDescriptor::package_abi_cxx11_(this->file_);
  }
  else {
    local_350 = Descriptor::full_name_abi_cxx11_(parent);
  }
  sVar23 = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_350);
  psVar8 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  sVar24 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
  psVar8 = AllocateNameStrings_abi_cxx11_(this,sVar23,sVar24,alloc);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = psVar8;
  psVar8 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  sVar24 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
  psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)alloc_local);
  sVar23 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
  it.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)sVar23._M_len;
  ValidateSymbolName(this,sVar24,sVar23,(Message *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
       (PointerT<google::protobuf::SourceCodeInfo>)this->file_;
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
       (PointerT<google::protobuf::FileDescriptorTables>)result_local;
  *(byte *)((long)&(alloc_local->
                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ).pointers_.payload_.super_Base<char>.value + 1) =
       *(byte *)((long)&(alloc_local->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ).pointers_.payload_.super_Base<char>.value + 1) & 0xfe;
  *(byte *)((long)&(alloc_local->
                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ).pointers_.payload_.super_Base<char>.value + 1) =
       *(byte *)((long)&(alloc_local->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ).pointers_.payload_.super_Base<char>.value + 1) & 0xfd;
  *(byte *)((long)&(alloc_local->
                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ).pointers_.payload_.super_Base<char>.value + 1) =
       *(byte *)((long)&(alloc_local->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ).pointers_.payload_.super_Base<char>.value + 1) & 0x83;
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::FeatureSet>.value =
       (PointerT<google::protobuf::FeatureSet>)0x0;
  pTVar10 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->pool_->tables_);
  psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)alloc_local);
  _local_90 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
              ::find<std::__cxx11::string>
                        ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                          *)&pTVar10->well_known_types_,psVar9);
  pTVar10 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->pool_->tables_);
  _i_1 = absl::lts_20240722::container_internal::
         raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
         ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
                *)&pTVar10->well_known_types_);
  bVar1 = absl::lts_20240722::container_internal::operator!=((iterator *)local_90,(iterator *)&i_1);
  if (bVar1) {
    prVar11 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              ::iterator::operator->((iterator *)local_90);
    *(byte *)((long)&(alloc_local->
                     super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     ).pointers_.payload_.super_Base<char>.value + 1) =
         *(byte *)((long)&(alloc_local->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          ).pointers_.payload_.super_Base<char>.value + 1) & 0x83 |
         ((byte)prVar11->second & 0x1f) << 2;
  }
  *(undefined2 *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 2) = 0;
  i_2 = 0;
  while( true ) {
    uVar2 = std::numeric_limits<unsigned_short>::max();
    bVar1 = false;
    if (i_2 < (int)(uint)uVar2) {
      iVar3 = DescriptorProto::field_size((DescriptorProto *)parent_local);
      bVar1 = false;
      if (i_2 < iVar3) {
        pFVar12 = DescriptorProto::field((DescriptorProto *)parent_local,i_2);
        iVar4 = FieldDescriptorProto::number(pFVar12);
        bVar1 = iVar4 == i_2 + 1;
      }
    }
    if (!bVar1) break;
    *(short *)((long)&(alloc_local->
                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ).pointers_.payload_.super_Base<char>.value + 2) = (short)i_2 + 1;
    i_2 = i_2 + 1;
  }
  iVar3 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value = iVar3;
  iVar3 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local);
  pEVar13 = (PointerT<google::protobuf::EnumValueOptions>)
            anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::OneofDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar3);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::EnumValueOptions>.value = pEVar13;
  for (i_3 = 0; iVar3 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local),
      i_3 < iVar3; i_3 = i_3 + 1) {
    proto_01 = DescriptorProto::oneof_decl((DescriptorProto *)parent_local,i_3);
    BuildOneof(this,proto_01,(Descriptor *)alloc_local,
               (OneofDescriptor *)
               ((long)&((alloc_local->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ).pointers_.payload_.super_Base<google::protobuf::EnumValueOptions>.value)->
                       super_Message + (long)i_3 * 0x38),alloc);
  }
  iVar3 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  *(int *)((long)&(alloc_local->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ).pointers_.payload_.super_Base<char>.value + 4) = iVar3;
  iVar3 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  pFVar14 = anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar3);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::EnumOptions>.value =
       (PointerT<google::protobuf::EnumOptions>)pFVar14;
  for (i_4 = 0; iVar3 = DescriptorProto::field_size((DescriptorProto *)parent_local), i_4 < iVar3;
      i_4 = i_4 + 1) {
    pFVar12 = DescriptorProto::field((DescriptorProto *)parent_local,i_4);
    BuildField(this,pFVar12,(Descriptor *)alloc_local,
               (FieldDescriptor *)
               ((alloc_local->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ).pointers_.payload_.super_Base<google::protobuf::EnumOptions>.value + i_4),alloc);
  }
  iVar3 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::MessageOptions>.value = iVar3;
  iVar3 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  pEVar15 = anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar3);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::OneofOptions>.value =
       (PointerT<google::protobuf::OneofOptions>)pEVar15;
  for (i_5 = 0; iVar3 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local),
      i_5 < iVar3; i_5 = i_5 + 1) {
    proto_02 = DescriptorProto::enum_type((DescriptorProto *)parent_local,i_5);
    BuildEnum(this,proto_02,(Descriptor *)alloc_local,
              (EnumDescriptor *)
              ((long)(alloc_local->
                     super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     ).pointers_.payload_.super_Base<google::protobuf::OneofOptions>.value +
              (long)i_5 * 0x58),alloc);
  }
  iVar3 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::FieldOptions>.value = iVar3;
  iVar3 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  pSVar16 = (PointerT<google::protobuf::ServiceOptions>)
            anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::Descriptor::ExtensionRange>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar3);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::ServiceOptions>.value = pSVar16;
  for (i_6 = 0; iVar3 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local),
      i_6 < iVar3; i_6 = i_6 + 1) {
    pDVar17 = DescriptorProto::extension_range((DescriptorProto *)parent_local,i_6);
    BuildExtensionRange(this,pDVar17,(Descriptor *)alloc_local,
                        (ExtensionRange *)
                        ((long)&((alloc_local->
                                 super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                 ).pointers_.payload_.super_Base<google::protobuf::ServiceOptions>.
                                value)->super_Message + (long)i_6 * 0x28),alloc);
  }
  iVar3 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::EnumOptions>.value = iVar3;
  iVar3 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  pFVar14 = anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar3);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::MethodOptions>.value =
       (PointerT<google::protobuf::MethodOptions>)pFVar14;
  for (local_b8 = 0; iVar3 = DescriptorProto::extension_size((DescriptorProto *)parent_local),
      local_b8 < iVar3; local_b8 = local_b8 + 1) {
    pFVar12 = DescriptorProto::extension((DescriptorProto *)parent_local,local_b8);
    BuildExtension(this,pFVar12,(Descriptor *)alloc_local,
                   (FieldDescriptor *)
                   ((alloc_local->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).pointers_.payload_.super_Base<google::protobuf::MethodOptions>.value +
                   local_b8),alloc);
  }
  iVar3 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::EnumValueOptions>.value = iVar3;
  iVar3 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
  pFVar18 = (PointerT<google::protobuf::FileOptions>)
            anon_unknown_23::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::Descriptor::ReservedRange>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar3);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::FileOptions>.value = pFVar18;
  for (local_bc = 0; iVar3 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local),
      pDVar20 = parent_local, descriptor = alloc_local, local_bc < iVar3; local_bc = local_bc + 1) {
    pDVar19 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,local_bc);
    BuildReservedRange(this,pDVar19,(Descriptor *)alloc_local,
                       (ReservedRange *)
                       (&(((alloc_local->
                           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ).pointers_.payload_.super_Base<google::protobuf::FileOptions>.value)->
                         super_Message).super_MessageLite._vptr_MessageLite + local_bc),alloc);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&revert,
             "google.protobuf.MessageOptions");
  AllocateOptions<google::protobuf::Descriptor>
            (this,(Proto *)pDVar20,(Descriptor *)descriptor,7,_revert,alloc);
  this->recursion_depth_ = this->recursion_depth_ + -1;
  local_d8.to_increment = &this->recursion_depth_;
  if (this->recursion_depth_ < 1) {
    psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)alloc_local);
    local_e8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
    AddError(this,local_e8,(Message *)parent_local,OTHER,
             "Reached maximum recursion limit for nested messages.");
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).pointers_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value =
         (PointerT<google::protobuf::ExtensionRangeOptions>)0x0;
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).total_.payload_.super_Base<google::protobuf::FeatureSet>.value = 0;
    reserved_name_count = 1;
  }
  else {
    iVar3 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).total_.payload_.super_Base<google::protobuf::FeatureSet>.value = iVar3;
    iVar3 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
    pDVar20 = anon_unknown_23::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::Descriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar3);
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).pointers_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value =
         (PointerT<google::protobuf::ExtensionRangeOptions>)pDVar20;
    for (i_8 = 0; iVar3 = i_8,
        iVar5 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local), iVar3 < iVar5;
        i_8 = i_8 + 1) {
      proto_03 = DescriptorProto::nested_type((DescriptorProto *)parent_local,i_8);
      BuildMessage(this,proto_03,(Descriptor *)alloc_local,
                   (Descriptor *)
                   ((long)(alloc_local->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          ).pointers_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.
                          value + (long)i_8 * 0x98),alloc);
    }
    local_100 = DescriptorProto::reserved_name_size((DescriptorProto *)parent_local);
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).total_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value = local_100;
    ppbVar21 = (anonymous_namespace)::
               FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
               ::AllocateArray<std::__cxx11::string_const*>
                         ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                           *)alloc,local_100);
    *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
     &(alloc_local->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).total_.payload_ = ppbVar21;
    for (local_104 = 0; local_104 < local_100; local_104 = local_104 + 1) {
      psVar8 = DescriptorProto::reserved_name_abi_cxx11_((DescriptorProto *)parent_local,local_104);
      psVar8 = (anonymous_namespace)::
               FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
               ::AllocateStrings<std::__cxx11::string_const&>
                         ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                           *)alloc,psVar8);
      *(string **)
       (*(long *)&(alloc_local->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ).total_.payload_ + (long)local_104 * 8) = psVar8;
    }
    psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)alloc_local);
    local_118 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
    pDVar20 = result_local;
    psVar9 = Descriptor::name_abi_cxx11_((Descriptor *)alloc_local);
    local_128 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
    proto_00 = parent_local;
    Symbol::Symbol(&stack0xfffffffffffffed0,(Descriptor *)alloc_local);
    AddSymbol(this,local_118,pDVar20,local_128,(Message *)proto_00,SStack_130);
    range1._4_4_ = 0;
    while( true ) {
      iVar3 = range1._4_4_;
      iVar5 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
      if (iVar5 <= iVar3) break;
      pDStack_140 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range1._4_4_);
      range2._4_4_ = range1._4_4_;
      while( true ) {
        range2._4_4_ = range2._4_4_ + 1;
        iVar3 = range2._4_4_;
        iVar5 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
        if (iVar5 <= iVar3) break;
        local_150.p = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range2._4_4_);
        iVar4 = DescriptorProto_ReservedRange::end(pDStack_140);
        iVar6 = DescriptorProto_ReservedRange::start((DescriptorProto_ReservedRange *)local_150.p);
        if (iVar6 < iVar4) {
          iVar4 = DescriptorProto_ReservedRange::end((DescriptorProto_ReservedRange *)local_150.p);
          iVar6 = DescriptorProto_ReservedRange::start(pDStack_140);
          if (iVar6 < iVar4) {
            psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)alloc_local);
            sVar24 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
            local_160 = sVar24;
            pDVar19 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range1._4_4_);
            reserved_name_set.
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array = local_150;
            absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_170,
                       (anon_class_16_2_65e56138 *)
                       ((long)&reserved_name_set.
                               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8));
            make_error.invoker_ = p_Stack_168;
            make_error.ptr_.obj = local_170.obj;
            AddError(this,local_160,&pDVar19->super_Message,NUMBER,make_error);
          }
        }
      }
      range1._4_4_ = range1._4_4_ + 1;
    }
    absl::lts_20240722::
    flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&__range2);
    this_00 = DescriptorProto::reserved_name_abi_cxx11_((DescriptorProto *)parent_local);
    __end2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(this_00);
    name = (string *)
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(this_00);
    while( true ) {
      bVar1 = internal::operator!=(&__end2,(iterator *)&name);
      if (!bVar1) break;
      local_1c0 = internal::
                  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2);
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::
      insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0,_0>
                (&local_1d8,
                 (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&__range2,local_1c0);
      if (((local_1d8.second ^ 0xffU) & 1) != 0) {
        sVar24 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c0);
        pDVar20 = parent_local;
        aStack_200.name = local_1c0;
        local_1e8 = sVar24;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_1f8,&stack0xfffffffffffffe00);
        make_error_00.invoker_ = p_Stack_1f0;
        make_error_00.ptr_.obj = local_1f8.obj;
        AddError(this,local_1e8,(Message *)pDVar20,NAME,make_error_00);
      }
      internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    field._4_4_ = 0;
    while( true ) {
      iVar3 = field._4_4_;
      iVar5 = Descriptor::field_count((Descriptor *)alloc_local);
      if (iVar5 <= iVar3) break;
      pFStack_210 = Descriptor::field((Descriptor *)alloc_local,field._4_4_);
      range._4_4_ = 0;
      while( true ) {
        iVar3 = range._4_4_;
        iVar5 = Descriptor::extension_range_count((Descriptor *)alloc_local);
        if (iVar5 <= iVar3) break;
        local_220 = Descriptor::extension_range((Descriptor *)alloc_local,range._4_4_);
        iVar3 = Descriptor::ExtensionRange::start_number(local_220);
        iVar5 = FieldDescriptor::number(pFStack_210);
        if (iVar3 <= iVar5) {
          iVar3 = FieldDescriptor::number(pFStack_210);
          iVar5 = Descriptor::ExtensionRange::end_number(local_220);
          if (iVar3 < iVar5) {
            pMVar22 = absl::lts_20240722::container_internal::
                      raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                      ::
                      operator[]<google::protobuf::Descriptor*,absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                                ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                                  *)&this->message_hints_,
                                 (key_arg<google::protobuf::Descriptor_*> *)&alloc_local);
            pDVar17 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range._4_4_);
            MessageHints::RequestHintOnFieldNumbers(pMVar22,&pDVar17->super_Message,NUMBER,0,1);
            psVar9 = FieldDescriptor::full_name_abi_cxx11_(pFStack_210);
            sVar24 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
            local_230 = sVar24;
            pDVar17 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range._4_4_);
            _auStack_250 = &local_220;
            local_248 = &stack0xfffffffffffffdf0;
            absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_240,
                       (anon_class_16_2_b8514d46 *)auStack_250);
            make_error_01.invoker_ = p_Stack_238;
            make_error_01.ptr_.obj = local_240.obj;
            AddError(this,local_230,&pDVar17->super_Message,NUMBER,make_error_01);
          }
        }
        range._4_4_ = range._4_4_ + 1;
      }
      range_1._4_4_ = 0;
      while( true ) {
        iVar3 = range_1._4_4_;
        iVar5 = Descriptor::reserved_range_count((Descriptor *)alloc_local);
        if (iVar5 <= iVar3) break;
        local_260 = Descriptor::reserved_range((Descriptor *)alloc_local,range_1._4_4_);
        iVar3 = local_260->start;
        iVar5 = FieldDescriptor::number(pFStack_210);
        if (iVar3 <= iVar5) {
          iVar3 = FieldDescriptor::number(pFStack_210);
          if (iVar3 < local_260->end) {
            pMVar22 = absl::lts_20240722::container_internal::
                      raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                      ::
                      operator[]<google::protobuf::Descriptor*,absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                                ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                                  *)&this->message_hints_,
                                 (key_arg<google::protobuf::Descriptor_*> *)&alloc_local);
            pDVar19 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range_1._4_4_)
            ;
            MessageHints::RequestHintOnFieldNumbers(pMVar22,&pDVar19->super_Message,NUMBER,0,1);
            psVar9 = FieldDescriptor::full_name_abi_cxx11_(pFStack_210);
            sVar24 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
            local_270 = sVar24;
            pDVar19 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range_1._4_4_)
            ;
            local_288.field = &stack0xfffffffffffffdf0;
            absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_280,&local_288);
            make_error_02.invoker_ = p_Stack_278;
            make_error_02.ptr_.obj = local_280.obj;
            AddError(this,local_270,&pDVar19->super_Message,NUMBER,make_error_02);
          }
        }
        range_1._4_4_ = range_1._4_4_ + 1;
      }
      psVar9 = FieldDescriptor::name_abi_cxx11_(pFStack_210);
      bVar1 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::contains<std::__cxx11::string>
                        ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)&__range2,psVar9);
      if (bVar1) {
        psVar9 = FieldDescriptor::full_name_abi_cxx11_(pFStack_210);
        sVar24 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
        local_298 = sVar24;
        pFVar12 = DescriptorProto::field((DescriptorProto *)parent_local,field._4_4_);
        aStack_2b0.field = &stack0xfffffffffffffdf0;
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_2a8,&stack0xfffffffffffffd50);
        make_error_03.invoker_ = p_Stack_2a0;
        make_error_03.ptr_.obj = local_2a8.obj;
        AddError(this,local_298,&pFVar12->super_Message,NAME,make_error_03);
      }
      field._4_4_ = field._4_4_ + 1;
    }
    range1_1._4_4_ = 0;
    while( true ) {
      iVar3 = range1_1._4_4_;
      iVar5 = Descriptor::extension_range_count((Descriptor *)alloc_local);
      if (iVar5 <= iVar3) break;
      pEStack_2c0 = Descriptor::extension_range((Descriptor *)alloc_local,range1_1._4_4_);
      range2_1._4_4_ = 0;
      while( true ) {
        iVar5 = range2_1._4_4_;
        iVar7 = Descriptor::reserved_range_count((Descriptor *)alloc_local);
        iVar3 = range1_1._4_4_;
        if (iVar7 <= iVar5) break;
        local_2d0 = Descriptor::reserved_range((Descriptor *)alloc_local,range2_1._4_4_);
        iVar3 = Descriptor::ExtensionRange::end_number(pEStack_2c0);
        if (local_2d0->start < iVar3) {
          iVar3 = local_2d0->end;
          iVar5 = Descriptor::ExtensionRange::start_number(pEStack_2c0);
          if (iVar5 < iVar3) {
            psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)alloc_local);
            sVar24 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
            local_2e0 = sVar24;
            pDVar17 = DescriptorProto::extension_range
                                ((DescriptorProto *)parent_local,range1_1._4_4_);
            _auStack_300 = &stack0xfffffffffffffd40;
            local_2f8 = &local_2d0;
            absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_2f0,
                       (anon_class_16_2_65e5611a *)auStack_300);
            make_error_04.invoker_ = p_Stack_2e8;
            make_error_04.ptr_.obj = local_2f0.obj;
            AddError(this,local_2e0,&pDVar17->super_Message,NUMBER,make_error_04);
          }
        }
        range2_1._4_4_ = range2_1._4_4_ + 1;
      }
      while( true ) {
        range2_2._4_4_ = iVar3 + 1;
        iVar3 = range2_2._4_4_;
        iVar5 = Descriptor::extension_range_count((Descriptor *)alloc_local);
        if (iVar5 <= iVar3) break;
        local_310 = Descriptor::extension_range((Descriptor *)alloc_local,range2_2._4_4_);
        iVar5 = Descriptor::ExtensionRange::end_number(pEStack_2c0);
        iVar7 = Descriptor::ExtensionRange::start_number(local_310);
        iVar3 = range2_2._4_4_;
        if (iVar7 < iVar5) {
          iVar5 = Descriptor::ExtensionRange::end_number(local_310);
          iVar7 = Descriptor::ExtensionRange::start_number(pEStack_2c0);
          iVar3 = range2_2._4_4_;
          if (iVar7 < iVar5) {
            psVar9 = Descriptor::full_name_abi_cxx11_((Descriptor *)alloc_local);
            sVar24 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
            local_320 = sVar24;
            pDVar17 = DescriptorProto::extension_range
                                ((DescriptorProto *)parent_local,range1_1._4_4_);
            local_340.range2 = &local_310;
            local_340.range1 = &stack0xfffffffffffffd40;
            absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_330,&local_340);
            make_error_05.invoker_ = p_Stack_328;
            make_error_05.ptr_.obj = local_330.obj;
            AddError(this,local_320,&pDVar17->super_Message,NUMBER,make_error_05);
            iVar3 = range2_2._4_4_;
          }
        }
      }
      range1_1._4_4_ = range1_1._4_4_ + 1;
    }
    absl::lts_20240722::
    flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&__range2);
    reserved_name_count = 0;
  }
  anon_unknown_23::IncrementWhenDestroyed::~IncrementWhenDestroyed(&local_d8);
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result,
                                     internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  result->all_names_ = AllocateNameStrings(scope, proto.name(), alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->well_known_type_ = Descriptor::WELLKNOWNTYPE_UNSPECIFIED;
  result->options_ = nullptr;  // Set to default_instance later if necessary.

  auto it = pool_->tables_->well_known_types_.find(result->full_name());
  if (it != pool_->tables_->well_known_types_.end()) {
    result->well_known_type_ = it->second;
  }

  // Calculate the continuous sequence of fields.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_field_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // messages, but it is unlikely.
  result->sequential_field_limit_ = 0;
  for (int i = 0; i < std::numeric_limits<uint16_t>::max() &&
                  i < proto.field_size() && proto.field(i).number() == i + 1;
       ++i) {
    result->sequential_field_limit_ = i + 1;
  }

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl, BuildOneof, result);
  BUILD_ARRAY(proto, result, field, BuildField, result);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension, BuildExtension, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy options.
  AllocateOptions(proto, result, DescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MessageOptions", alloc);

  // Before building submessages, check recursion limit.
  --recursion_depth_;
  IncrementWhenDestroyed revert{recursion_depth_};
  if (recursion_depth_ <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Reached maximum recursion limit for nested messages.");
    result->nested_types_ = nullptr;
    result->nested_type_count_ = 0;
    return;
  }
  BUILD_ARRAY(proto, result, nested_type, BuildMessage, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end() - 1, range1.start(),
                       range1.end() - 1);
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Field name \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }
  // Check that fields aren't using reserved names or numbers and that they
  // aren't using extension numbers.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start_number() <= field->number() &&
          field->number() < range->end_number()) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.extension_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 includes field \"$2\" ($3).",
                       range->start_number(), range->end_number() - 1,
                       field->name(), field->number());
                 });
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.reserved_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Field \"$0\" uses reserved number $1.", field->name(),
                       field->number());
                 });
      }
    }
    if (reserved_name_set.contains(field->name())) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Field name \"$0\" is reserved.",
                                         field->name());
               });
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers or names.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end_number() > range2->start &&
          range2->end > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "reserved range $2 to $3.",
                       range1->start_number(), range1->end_number() - 1,
                       range2->start, range2->end - 1);
                 });
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end_number() > range2->start_number() &&
          range2->end_number() > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2->start_number(), range2->end_number() - 1,
                       range1->start_number(), range1->end_number() - 1);
                 });
      }
    }
  }
}